

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  FILE *__stream;
  Message *pMVar1;
  undefined8 uVar2;
  char *pcVar3;
  String local_68;
  internal local_58 [48];
  Message local_28;
  Message errors;
  int line_local;
  char *file_local;
  char *test_case_name_local;
  
  errors.ss_.ptr_._4_4_ = line;
  file_local = test_case_name;
  Message::Message(&local_28);
  pMVar1 = Message::operator<<(&local_28,(char (*) [37])"Attempted redefinition of test case ");
  pMVar1 = Message::operator<<(pMVar1,&file_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x15fd56);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [64])
                                      "All tests in the same test case must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [31])"class.  However, in test case ");
  pMVar1 = Message::operator<<(pMVar1,&file_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [12])0x15fa7e);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(local_58,file,errors.ss_.ptr_._4_4_);
  uVar2 = std::__cxx11::string::c_str();
  Message::GetString((Message *)&local_68);
  pcVar3 = String::c_str(&local_68);
  fprintf(__stream,"%s %s",uVar2,pcVar3);
  String::~String(&local_68);
  std::__cxx11::string::~string((string *)local_58);
  Message::~Message(&local_28);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}